

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,char *filename)

{
  REF_INT node0;
  int node1;
  REF_NODE ref_node;
  double dVar1;
  double dVar2;
  uint uVar3;
  REF_DBL *scalar;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  char *vars [2];
  REF_EDGE local_68;
  REF_GRID local_60;
  char *local_58;
  double local_50;
  char *local_48;
  char *local_40;
  
  ref_node = ref_grid->node;
  local_48 = "s";
  local_40 = "l";
  uVar3 = ref_node->max;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x119f
           ,"ref_gather_volume_status_tec","malloc scalar of REF_DBL negative");
    uVar3 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(uVar7 << 4);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x119f,"ref_gather_volume_status_tec","malloc scalar of REF_DBL NULL");
      uVar3 = 2;
    }
    else {
      if (uVar7 != 0) {
        lVar4 = 0;
        do {
          scalar[lVar4] = 1.0;
          (scalar + lVar4)[1] = 1.0;
          lVar4 = lVar4 + 2;
        } while (uVar7 * 2 != lVar4);
      }
      uVar3 = ref_edge_create(&local_68,ref_grid);
      if (uVar3 == 0) {
        local_60 = ref_grid;
        local_58 = filename;
        if (0 < local_68->n) {
          lVar4 = 0;
          do {
            node0 = local_68->e2n[lVar4 * 2];
            node1 = local_68->e2n[lVar4 * 2 + 1];
            uVar3 = ref_node_ratio(ref_node,node0,node1,&local_50);
            if (uVar3 != 0) {
              pcVar6 = "ratio";
              uVar5 = 0x11a4;
              goto LAB_0013e7da;
            }
            dVar1 = scalar[(long)node0 * 2];
            dVar2 = (scalar + (long)node0 * 2)[1];
            uVar7 = -(ulong)(dVar1 < local_50);
            uVar8 = -(ulong)(local_50 < dVar2);
            scalar[(long)node0 * 2] = (REF_DBL)(~uVar7 & (ulong)local_50 | (ulong)dVar1 & uVar7);
            (scalar + (long)node0 * 2)[1] =
                 (REF_DBL)(~uVar8 & (ulong)local_50 | (ulong)dVar2 & uVar8);
            dVar1 = scalar[(long)node1 * 2];
            dVar2 = (scalar + (long)node1 * 2)[1];
            uVar7 = -(ulong)(dVar1 < local_50);
            uVar8 = -(ulong)(local_50 < dVar2);
            scalar[(long)node1 * 2] = (REF_DBL)(~uVar7 & (ulong)local_50 | (ulong)dVar1 & uVar7);
            (scalar + (long)node1 * 2)[1] =
                 (REF_DBL)(~uVar8 & (ulong)local_50 | (ulong)dVar2 & uVar8);
            lVar4 = lVar4 + 1;
          } while (lVar4 < local_68->n);
        }
        uVar3 = ref_edge_free(local_68);
        if (uVar3 == 0) {
          uVar3 = ref_gather_scalar_by_extension(local_60,2,scalar,&local_48,local_58);
          if (uVar3 == 0) {
            free(scalar);
            return 0;
          }
          pcVar6 = "dump";
          uVar5 = 0x11ad;
        }
        else {
          pcVar6 = "free edges";
          uVar5 = 0x11aa;
        }
      }
      else {
        pcVar6 = "create edges";
        uVar5 = 0x11a0;
      }
LAB_0013e7da:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar5,"ref_gather_volume_status_tec",(ulong)uVar3,pcVar6);
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL *scalar, edge_ratio;
  const char *vars[2];
  REF_INT ldim = 2;

  vars[0] = "s";
  vars[1] = "l";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[0 + ldim * node0] = MIN(scalar[0 + ldim * node0], edge_ratio);
    scalar[0 + ldim * node1] = MIN(scalar[0 + ldim * node1], edge_ratio);
    scalar[1 + ldim * node0] = MAX(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MAX(scalar[1 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_by_extension(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}